

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_stack.hpp
# Opt level: O2

thread_info_base *
asio::detail::call_stack<asio::detail::thread_context,_asio::detail::thread_info_base>::contains
          (thread_context *k)

{
  long *plVar1;
  long *in_FS_OFFSET;
  
  plVar1 = (long *)(*in_FS_OFFSET + -0x2860);
  while( true ) {
    plVar1 = (long *)*plVar1;
    if (plVar1 == (long *)0x0) {
      return (thread_info_base *)0x0;
    }
    if ((thread_context *)*plVar1 == k) break;
    plVar1 = plVar1 + 2;
  }
  return (thread_info_base *)plVar1[1];
}

Assistant:

static Value* contains(Key* k)
  {
    context* elem = top_;
    while (elem)
    {
      if (elem->key_ == k)
        return elem->value_;
      elem = elem->next_;
    }
    return 0;
  }